

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlTextReaderIsEmptyElement(xmlTextReaderPtr reader)

{
  xmlNodePtr pxVar1;
  int iVar2;
  
  iVar2 = -1;
  if (((((reader != (xmlTextReaderPtr)0x0) && (pxVar1 = reader->node, pxVar1 != (xmlNodePtr)0x0)) &&
       (iVar2 = 0, pxVar1->type == XML_ELEMENT_NODE)) &&
      ((reader->curnode == (xmlNodePtr)0x0 && (pxVar1->children == (_xmlNode *)0x0)))) &&
     (reader->state != XML_TEXTREADER_END)) {
    iVar2 = 1;
    if ((reader->doc == (xmlDocPtr)0x0) && (reader->in_xinclude < 1)) {
      return pxVar1->extra & 1;
    }
  }
  return iVar2;
}

Assistant:

int
xmlTextReaderIsEmptyElement(xmlTextReaderPtr reader) {
    if ((reader == NULL) || (reader->node == NULL))
	return(-1);
    if (reader->node->type != XML_ELEMENT_NODE)
	return(0);
    if (reader->curnode != NULL)
	return(0);
    if (reader->node->children != NULL)
	return(0);
    if (reader->state == XML_TEXTREADER_END)
	return(0);
    if (reader->doc != NULL)
        return(1);
#ifdef LIBXML_XINCLUDE_ENABLED
    if (reader->in_xinclude > 0)
        return(1);
#endif
    return((reader->node->extra & NODE_IS_EMPTY) != 0);
}